

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O0

void Abc_ExactStoreTest(int fVerbose)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  char *pcVar2;
  Abc_Obj_t *pAVar3;
  int local_88;
  char local_84 [4];
  int Cost;
  char pPerm [4];
  Vec_Ptr_t *vNames;
  Abc_Obj_t *pFanins [4];
  Abc_Ntk_t *pNtk;
  int pArrTimeProfile [4];
  word pTruth [4];
  int local_10;
  int i;
  int fVerbose_local;
  
  pArrTimeProfile[2] = 0xcafe;
  pArrTimeProfile[3] = 0;
  pNtk = (Abc_Ntk_t *)0x200000006;
  pArrTimeProfile[0] = 8;
  pArrTimeProfile[1] = 5;
  memset(local_84,0,4);
  local_88 = 0;
  pNtk_00 = Abc_NtkAlloc(ABC_NTK_LOGIC,ABC_FUNC_SOP,1);
  pcVar2 = Extra_UtilStrsav("exact");
  pNtk_00->pName = pcVar2;
  _Cost = Abc_NodeGetFakeNames(4);
  Vec_PtrPush(pNtk_00->vObjs,(void *)0x0);
  for (local_10 = 0; local_10 < 4; local_10 = local_10 + 1) {
    pAVar3 = Abc_NtkCreatePi(pNtk_00);
    pFanins[(long)local_10 + -1] = pAVar3;
    pAVar3 = pFanins[(long)local_10 + -1];
    pcVar2 = (char *)Vec_PtrEntry(_Cost,local_10);
    Abc_ObjAssignName(pAVar3,pcVar2,(char *)0x0);
  }
  Abc_NodeFreeNames(_Cost);
  Abc_ExactStart(10000,1,fVerbose,0,(char *)0x0);
  pAVar3 = Abc_ExactBuildNode((word *)(pArrTimeProfile + 2),4,(int *)&pNtk,(Abc_Obj_t **)&vNames,
                              pNtk_00);
  if (pAVar3 != (Abc_Obj_t *)0x0) {
    __assert_fail("!Abc_ExactBuildNode( pTruth, 4, pArrTimeProfile, pFanins, pNtk )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                  ,0xbbc,"void Abc_ExactStoreTest(int)");
  }
  iVar1 = Abc_ExactDelayCost((word *)(pArrTimeProfile + 2),4,(int *)&pNtk,local_84,&local_88,0xc);
  if (iVar1 != 1) {
    __assert_fail("Abc_ExactDelayCost( pTruth, 4, pArrTimeProfile, pPerm, &Cost, 12 ) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                  ,0xbbe,"void Abc_ExactStoreTest(int)");
  }
  pAVar3 = Abc_ExactBuildNode((word *)(pArrTimeProfile + 2),4,(int *)&pNtk,(Abc_Obj_t **)&vNames,
                              pNtk_00);
  if (pAVar3 != (Abc_Obj_t *)0x0) {
    pNtk = (Abc_Ntk_t *)CONCAT44(pNtk._4_4_,(int)pNtk + 1);
    pAVar3 = Abc_ExactBuildNode((word *)(pArrTimeProfile + 2),4,(int *)&pNtk,(Abc_Obj_t **)&vNames,
                                pNtk_00);
    if (pAVar3 == (Abc_Obj_t *)0x0) {
      pNtk = (Abc_Ntk_t *)CONCAT44(pNtk._4_4_,(int)pNtk + -1);
      Abc_ExactStop((char *)0x0);
      Abc_NtkDelete(pNtk_00);
      return;
    }
    __assert_fail("!Abc_ExactBuildNode( pTruth, 4, pArrTimeProfile, pFanins, pNtk )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                  ,0xbc3,"void Abc_ExactStoreTest(int)");
  }
  __assert_fail("Abc_ExactBuildNode( pTruth, 4, pArrTimeProfile, pFanins, pNtk )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                ,0xbc0,"void Abc_ExactStoreTest(int)");
}

Assistant:

void Abc_ExactStoreTest( int fVerbose )
{
    int i;
    word pTruth[4] = {0xcafe, 0, 0, 0};
    int pArrTimeProfile[4] = {6, 2, 8, 5};
    Abc_Ntk_t * pNtk;
    Abc_Obj_t * pFanins[4];
    Vec_Ptr_t * vNames;
    char pPerm[4] = {0};
    int Cost = 0;

    pNtk = Abc_NtkAlloc( ABC_NTK_LOGIC, ABC_FUNC_SOP, 1 );
    pNtk->pName = Extra_UtilStrsav( "exact" );
    vNames = Abc_NodeGetFakeNames( 4u );

    /* primary inputs */
    Vec_PtrPush( pNtk->vObjs, NULL );
    for ( i = 0; i < 4; ++i )
    {
        pFanins[i] = Abc_NtkCreatePi( pNtk );
        Abc_ObjAssignName( pFanins[i], (char*)Vec_PtrEntry( vNames, i ), NULL );
    }
    Abc_NodeFreeNames( vNames );

    Abc_ExactStart( 10000, 1, fVerbose, 0, NULL );

    assert( !Abc_ExactBuildNode( pTruth, 4, pArrTimeProfile, pFanins, pNtk ) );

    assert( Abc_ExactDelayCost( pTruth, 4, pArrTimeProfile, pPerm, &Cost, 12 ) == 1 );

    assert( Abc_ExactBuildNode( pTruth, 4, pArrTimeProfile, pFanins, pNtk ) );

    (*pArrTimeProfile)++;
    assert( !Abc_ExactBuildNode( pTruth, 4, pArrTimeProfile, pFanins, pNtk ) );
    (*pArrTimeProfile)--;

    Abc_ExactStop( NULL );

    Abc_NtkDelete( pNtk );
}